

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseOffsetExpr(WastParser *this,ExprList *out_expr_list)

{
  bool bVar1;
  Result RVar2;
  allocator local_59;
  string local_58 [32];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  bVar1 = ParseOffsetExprOpt(this,out_expr_list);
  RVar2.enum_ = Ok;
  if (!bVar1) {
    std::__cxx11::string::string(local_58,"an offset expr",&local_59);
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
               local_58,&local_38);
    RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_38,"(i32.const 123)");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_38);
    std::__cxx11::string::_M_dispose();
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result WastParser::ParseOffsetExpr(ExprList* out_expr_list) {
  WABT_TRACE(ParseOffsetExpr);
  if (!ParseOffsetExprOpt(out_expr_list)) {
    return ErrorExpected({"an offset expr"}, "(i32.const 123)");
  }
  return Result::Ok;
}